

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

void Fra_ClassesCopyReprs(Fra_Cla_t *p,Vec_Ptr_t *vFailed)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  Aig_ManReprStart(p->pAig,p->pAig->vObjs->nSize);
  memmove(p->pAig->pReprs,p->pMemRepr,(long)p->pAig->vObjs->nSize << 3);
  if ((p->vClasses1->nSize == 0) && (p->vClasses->nSize == 0)) {
    pAVar2 = p->pAig;
    pVVar3 = pAVar2->vObjs;
    if (0 < pVVar3->nSize) {
      lVar4 = 0;
      do {
        if ((pVVar3->pArray[lVar4] != (void *)0x0) && (pAVar2->pReprs[lVar4] != (Aig_Obj_t *)0x0)) {
          puts("Classes are not cleared!");
          pAVar2 = p->pAig;
          if (pAVar2->pReprs[lVar4] != (Aig_Obj_t *)0x0) {
            __assert_fail("p->pAig->pReprs[i] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClass.c"
                          ,0x7e,"void Fra_ClassesCopyReprs(Fra_Cla_t *, Vec_Ptr_t *)");
          }
        }
        lVar4 = lVar4 + 1;
        pVVar3 = pAVar2->vObjs;
      } while (lVar4 < pVVar3->nSize);
    }
  }
  if ((vFailed != (Vec_Ptr_t *)0x0) && (iVar1 = vFailed->nSize, 0 < (long)iVar1)) {
    lVar4 = 0;
    do {
      p->pAig->pReprs[*(int *)((long)vFailed->pArray[lVar4] + 0x24)] = (Aig_Obj_t *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return;
}

Assistant:

void Fra_ClassesCopyReprs( Fra_Cla_t * p, Vec_Ptr_t * vFailed )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManReprStart( p->pAig, Aig_ManObjNumMax(p->pAig) );
    memmove( p->pAig->pReprs, p->pMemRepr, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p->pAig) );
    if ( Vec_PtrSize(p->vClasses1) == 0 && Vec_PtrSize(p->vClasses) == 0 )
    {
        Aig_ManForEachObj( p->pAig, pObj, i )
        {
            if ( p->pAig->pReprs[i] != NULL )
                printf( "Classes are not cleared!\n" );
            assert( p->pAig->pReprs[i] == NULL );
        }
    }
    if ( vFailed )
        Vec_PtrForEachEntry( Aig_Obj_t *, vFailed, pObj, i )
            p->pAig->pReprs[pObj->Id] = NULL;
}